

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  anon_union_8_1_a8a14541_for_iterator_2 local_18;
  
  AssertIsValidForComparison(a->ctrl_,'\0',(GenerationType *)0x0);
  AssertIsValidForComparison(b->ctrl_,'\0',(GenerationType *)0x0);
  local_18 = a->field_1;
  local_20 = b->field_1;
  AssertSameContainer(a->ctrl_,b->ctrl_,&local_18.slot_,&local_20.slot_,(GenerationType *)0x0,
                      (GenerationType *)0x0);
  return a->ctrl_ == b->ctrl_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }